

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O0

void __thiscall slang::parsing::ParserBase::Window::addNew(Window *this)

{
  long lVar1;
  long lVar2;
  Token *__dest;
  undefined8 *puVar3;
  long in_RDI;
  Token TVar4;
  Token *newBuffer;
  size_t shift;
  Token *local_60;
  undefined8 local_38;
  Info *local_30;
  
  if (*(ulong *)(in_RDI + 0x40) <= *(ulong *)(in_RDI + 0x38)) {
    lVar2 = *(long *)(in_RDI + 0x38) - *(long *)(in_RDI + 0x30);
    if (*(ulong *)(in_RDI + 0x40) >> 1 < *(ulong *)(in_RDI + 0x30)) {
      if (lVar2 != 0) {
        memmove(*(void **)(in_RDI + 8),
                (void *)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x30) * 0x10),lVar2 * 0x10);
      }
    }
    else {
      *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) << 1;
      lVar1 = *(long *)(in_RDI + 0x40);
      __dest = (Token *)operator_new__(0x8fe075);
      if (lVar1 != 0) {
        local_60 = __dest;
        do {
          Token::Token(local_60);
          local_60 = local_60 + 1;
        } while (local_60 != __dest + lVar1);
      }
      memcpy(__dest,(void *)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x30) * 0x10),lVar2 * 0x10);
      if (*(long *)(in_RDI + 8) != 0) {
        operator_delete__((void *)0x8fe11c);
      }
      *(Token **)(in_RDI + 8) = __dest;
    }
    *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) - *(long *)(in_RDI + 0x30);
    *(undefined8 *)(in_RDI + 0x30) = 0;
  }
  TVar4 = Preprocessor::next((Preprocessor *)0x8fe174);
  puVar3 = (undefined8 *)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x38) * 0x10);
  local_38 = TVar4._0_8_;
  *puVar3 = local_38;
  local_30 = TVar4.info;
  puVar3[1] = local_30;
  *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) + 1;
  return;
}

Assistant:

void ParserBase::Window::addNew() {
    if (count >= capacity) {
        // shift tokens to the left if we are too far to the right
        size_t shift = count - currentOffset;
        if (currentOffset > (capacity >> 1)) {
            if (shift > 0)
                memmove(buffer, buffer + currentOffset, shift * sizeof(Token));
        }
        else {
            capacity *= 2;
            Token* newBuffer = new Token[capacity];
            memcpy(newBuffer, buffer + currentOffset, shift * sizeof(Token));

            delete[] buffer;
            buffer = newBuffer;
        }

        count -= currentOffset;
        currentOffset = 0;
    }

    buffer[count] = tokenSource.next();
    count++;
}